

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

float __thiscall asmjit::Logger::logf(Logger *this,float __x)

{
  char in_AL;
  char *in_RSI;
  float extraout_XMM0_Da;
  va_list ap;
  __va_list_tag local_d8;
  undefined1 local_b8 [48];
  float local_88;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = __x;
  }
  local_d8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_d8.gp_offset = 0x10;
  local_d8.fp_offset = 0x30;
  logv(this,in_RSI,&local_d8);
  return extraout_XMM0_Da;
}

Assistant:

Error Logger::logf(const char* fmt, ...) noexcept {
  Error err;
  va_list ap;

  va_start(ap, fmt);
  err = logv(fmt, ap);
  va_end(ap);

  return err;
}